

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsLoadGeometryStages::Read<tcu::Vector<float,4>>
          (BasicAllFormatsLoadGeometryStages *this,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value)

{
  Vector<float,_4> *__value;
  GLenum internalformat_00;
  bool bVar1;
  GLuint GVar2;
  GLenum format;
  GLenum type;
  GLint GVar3;
  int iVar4;
  char *pcVar5;
  char *src_tcs;
  char *src_tes;
  char *src_gs;
  reference pixels;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  PixelFormat *pPVar7;
  float *pixels_00;
  undefined8 uVar8;
  string local_1a0;
  Vector<float,_4> local_17c;
  undefined1 local_16c [8];
  vec4 result;
  int i_4;
  vec4 g_color_eps;
  PixelFormat *pixelFormat;
  RenderTarget *renderTarget;
  GLuint i_3;
  GLuint i_2;
  int i_1;
  vec4 zero;
  int i;
  GLuint texture [8];
  allocator<tcu::Vector<float,_4>_> local_e9;
  undefined1 local_e8 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  undefined1 local_c8 [4];
  int kSize;
  string local_a8;
  string local_78;
  string local_58;
  GLuint local_34;
  Vector<float,_4> *pVStack_30;
  GLuint program;
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *value_local;
  BasicAllFormatsLoadGeometryStages *pBStack_18;
  GLenum internalformat_local;
  BasicAllFormatsLoadGeometryStages *this_local;
  
  pVStack_30 = expected_value;
  expected_value_local = value;
  value_local._4_4_ = internalformat;
  pBStack_18 = this;
  GenVS<tcu::Vector<float,4>>(&local_58,this,internalformat,expected_value);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  GenTCS<tcu::Vector<float,4>>(&local_78,this,value_local._4_4_,pVStack_30);
  src_tcs = (char *)std::__cxx11::string::c_str();
  GenTES<tcu::Vector<float,4>>(&local_a8,this,value_local._4_4_,pVStack_30);
  src_tes = (char *)std::__cxx11::string::c_str();
  GenGS<tcu::Vector<float,4>>((string *)local_c8,this,value_local._4_4_,pVStack_30);
  src_gs = (char *)std::__cxx11::string::c_str();
  GVar2 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,pcVar5,src_tcs,src_tes,src_gs,(char *)0x0,
                     (bool *)0x0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  __value = expected_value_local;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  local_34 = GVar2;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_e9);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_e8,1,
             __value,&local_e9);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_e9);
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),8,(GLuint *)(zero.m_data + 3));
  for (zero.m_data[2] = 0.0; (int)zero.m_data[2] < 4;
      zero.m_data[2] = (float)((int)zero.m_data[2] + 1)) {
    glu::CallLogWrapper::glBindTexture
              ((CallLogWrapper *)(this + 8),0x8c1a,
               (GLuint)zero.m_data[(long)(int)zero.m_data[2] + 3]);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2800,0x2600);
    internalformat_00 = value_local._4_4_;
    format = ShaderImageLoadStoreBase::Format<tcu::Vector<float,4>>
                       ((ShaderImageLoadStoreBase *)this);
    type = ShaderImageLoadStoreBase::Type<tcu::Vector<float,4>>((ShaderImageLoadStoreBase *)this);
    pixels = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_e8,0);
    glu::CallLogWrapper::glTexImage3D
              ((CallLogWrapper *)(this + 8),0x8c1a,0,internalformat_00,1,1,1,0,format,type,pixels);
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&i_2,0.0);
  for (i_3 = 4; (int)i_3 < 8; i_3 = i_3 + 1) {
    glu::CallLogWrapper::glBindTexture
              ((CallLogWrapper *)(this + 8),0xde1,(GLuint)zero.m_data[(long)(int)i_3 + 3]);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
    glu::CallLogWrapper::glTexImage2D
              ((CallLogWrapper *)(this + 8),0xde1,0,0x8814,1,1,0,0x1908,0x1406,&i_2);
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image0");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,0);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image1");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,1);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image2");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,2);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image3");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,3);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image0_result");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,4);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image1_result");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,5);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image2_result");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,6);
  GVar3 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),local_34,"g_image3_result");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar3,7);
  for (renderTarget._4_4_ = 0; renderTarget._4_4_ < 4; renderTarget._4_4_ = renderTarget._4_4_ + 1)
  {
    glu::CallLogWrapper::glBindImageTexture
              ((CallLogWrapper *)(this + 8),renderTarget._4_4_,
               (GLuint)zero.m_data[(ulong)renderTarget._4_4_ + 3],0,'\x01',0,35000,value_local._4_4_
              );
  }
  for (renderTarget._0_4_ = 4; (uint)renderTarget < 8; renderTarget._0_4_ = (uint)renderTarget + 1)
  {
    glu::CallLogWrapper::glBindImageTexture
              ((CallLogWrapper *)(this + 8),(uint)renderTarget,
               (GLuint)zero.m_data[(ulong)(uint)renderTarget + 3],0,'\0',0,0x88b9,0x8814);
  }
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,1);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0xe,0,1);
  glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,3);
  pRVar6 = deqp::Context::getRenderContext(*(Context **)(this + 0x20));
  iVar4 = (*pRVar6->_vptr_RenderContext[4])();
  pPVar7 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var,iVar4));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(result.m_data + 3),
             1.0 / (float)(1 << ((byte)pPVar7->redBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar7->greenBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar7->blueBits & 0x1f)),
             1.0 / (float)(1 << ((byte)pPVar7->alphaBits & 0x1f)));
  result.m_data[2] = 0.0;
  do {
    if (3 < (int)result.m_data[2]) {
      glu::CallLogWrapper::glDeleteTextures
                ((CallLogWrapper *)(this + 8),8,(GLuint *)(zero.m_data + 3));
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
      this_local._7_1_ = 1;
LAB_01040198:
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_e8)
      ;
      return (bool)(this_local._7_1_ & 1);
    }
    glu::CallLogWrapper::glBindTexture
              ((CallLogWrapper *)(this + 8),0xde1,
               (GLuint)zero.m_data[(long)((int)result.m_data[2] + 4) + 3]);
    glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_16c);
    pixels_00 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_16c,0);
    glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0xde1,0,0x1908,0x1406,pixels_00)
    ;
    tcu::Vector<float,_4>::Vector(&local_17c,0.0,1.0,0.0,1.0);
    bVar1 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::ColorEqual
                      ((ShaderImageLoadStoreBase *)this,(vec4 *)local_16c,&local_17c,
                       (vec4 *)(result.m_data + 3));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      glu::CallLogWrapper::glDeleteTextures
                ((CallLogWrapper *)(this + 8),8,(GLuint *)(zero.m_data + 3));
      glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
      glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
      ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
                (&local_1a0,(ShaderImageLoadStoreBase *)this,value_local._4_4_);
      uVar8 = std::__cxx11::string::c_str();
      pcVar5 = gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::StageName
                         ((ShaderImageLoadStoreBase *)this,(int)result.m_data[2]);
      gl4cts::anon_unknown_0::Output("Bad load value. Format is: %s. Stage is: %s.\n",uVar8,pcVar5);
      std::__cxx11::string::~string((string *)&local_1a0);
      this_local._7_1_ = 0;
      goto LAB_01040198;
    }
    result.m_data[2] = (float)((int)result.m_data[2] + 1);
  } while( true );
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value)
	{
		const GLuint program = BuildProgram(
			GenVS(internalformat, expected_value).c_str(), GenTCS(internalformat, expected_value).c_str(),
			GenTES(internalformat, expected_value).c_str(), GenGS(internalformat, expected_value).c_str(), NULL);
		const int	  kSize = 1;
		std::vector<T> data(kSize * kSize, value);
		GLuint		   texture[8];
		glGenTextures(8, texture);

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D_ARRAY, texture[i]);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 1, 0, Format<T>(), Type<T>(), &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);
		vec4 zero(0);
		for (int i = 4; i < 8; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i]);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, kSize, kSize, 0, GL_RGBA, GL_FLOAT, &zero);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image0"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image1"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image2"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image3"), 3);
		glUniform1i(glGetUniformLocation(program, "g_image0_result"), 4);
		glUniform1i(glGetUniformLocation(program, "g_image1_result"), 5);
		glUniform1i(glGetUniformLocation(program, "g_image2_result"), 6);
		glUniform1i(glGetUniformLocation(program, "g_image3_result"), 7);

		for (GLuint i = 0; i < 4; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);
		}
		for (GLuint i = 4; i < 8; ++i)
		{
			glBindImageTexture(i, texture[i], 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32F);
		}
		glBindVertexArray(m_vao);
		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glPatchParameteri(GL_PATCH_VERTICES, 3);

		const tcu::RenderTarget& renderTarget = m_context.getRenderContext().getRenderTarget();
		const tcu::PixelFormat&  pixelFormat  = renderTarget.getPixelFormat();
		vec4					 g_color_eps  = vec4(
			1.f / static_cast<float>(1 << pixelFormat.redBits), 1.f / static_cast<float>(1 << pixelFormat.greenBits),
			1.f / static_cast<float>(1 << pixelFormat.blueBits), 1.f / static_cast<float>(1 << pixelFormat.alphaBits));

		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(GL_TEXTURE_2D, texture[i + 4]);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			vec4 result;
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA, GL_FLOAT, &result[0]);
			if (!ColorEqual(result, vec4(0, 1, 0, 1), g_color_eps))
			{
				glDeleteTextures(8, texture);
				glUseProgram(0);
				glDeleteProgram(program);
				Output("Bad load value. Format is: %s. Stage is: %s.\n", FormatEnumToString(internalformat).c_str(),
					   StageName(i));
				return false;
			}
		}
		glDeleteTextures(8, texture);
		glUseProgram(0);
		glDeleteProgram(program);
		return true;
	}